

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_array.cpp
# Opt level: O1

void __thiscall
JsonArray_BeginArrayReturnsError_Test::TestBody(JsonArray_BeginArrayReturnsError_Test *this)

{
  FunctionMocker<std::error_code_()> *this_00;
  error_category *peVar1;
  int iVar2;
  TypedExpectation<std::error_code_()> *this_01;
  ActionInterface<std::error_code_()> *impl;
  char *pcVar3;
  AssertionResult gtest_ar;
  error_code error;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  coord local_108;
  span<const_char,__1L> local_100;
  undefined1 local_f0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_e0;
  error_code local_d0;
  undefined1 local_c0 [16];
  _Manager_type local_b0;
  error_code local_68 [2];
  _Alloc_hider local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  coord local_28;
  
  local_d0._M_cat = (error_category *)std::_V2::generic_category();
  local_d0._M_value = 5;
  this_00 = &(this->super_JsonArray).callbacks_.super_mock_json_callbacks.gmock00_begin_array_50;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,&(this->super_JsonArray).callbacks_);
  local_f0 = (undefined1  [8])this_00;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<std::error_code_()>::InternalExpectedAt
                      ((MockSpec<std::error_code_()> *)local_f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
                       ,0x37,"callbacks_","begin_array ()");
  peVar1 = local_d0._M_cat;
  iVar2 = local_d0._M_value;
  local_100.storage_.super_extent_type<_1L>.size_ = (index_type)operator_new(0x10);
  *(int *)local_100.storage_.super_extent_type<_1L>.size_ = iVar2;
  *(error_category **)(local_100.storage_.super_extent_type<_1L>.size_ + 8) = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::error_code*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_100.storage_.data_,
             (error_code *)local_100.storage_.super_extent_type<_1L>.size_);
  impl = (ActionInterface<std::error_code_()> *)operator_new(0x28);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_001be708;
  peVar1 = *(error_category **)(local_100.storage_.super_extent_type<_1L>.size_ + 8);
  impl[1]._vptr_ActionInterface = *(_func_int ***)local_100.storage_.super_extent_type<_1L>.size_;
  impl[2]._vptr_ActionInterface = (_func_int **)peVar1;
  *(undefined4 *)&impl[3]._vptr_ActionInterface = *(undefined4 *)&impl[1]._vptr_ActionInterface;
  impl[4]._vptr_ActionInterface = impl[2]._vptr_ActionInterface;
  testing::Action<std::error_code_()>::Action((Action<std::error_code_()> *)local_c0,impl);
  testing::internal::TypedExpectation<std::error_code_()>::WillOnce
            (this_01,(Action<std::error_code_()> *)local_c0);
  if (local_b0 != (_Manager_type)0x0) {
    (*local_b0)((_Any_data *)local_c0,(_Any_data *)local_c0,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100.storage_.data_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100.storage_.data_);
  }
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_c0,
             (this->super_JsonArray).proxy_.original_,none);
  local_e0._vptr__Sp_counted_base._0_4_ = 0xa5d0a5b;
  local_e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000004;
  local_e0._vptr__Sp_counted_base._4_4_ = local_e0._vptr__Sp_counted_base._4_4_ & 0xffffff00;
  local_f0 = (undefined1  [8])&local_e0;
  pstore::gsl::details::extent_type<-1L>::extent_type((extent_type<_1L> *)&local_100,4);
  local_100.storage_.data_ = (pointer)&local_e0;
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
  input<pstore::gsl::span<char_const,_1l>>
            ((parser<callbacks_proxy<mock_json_callbacks>> *)local_c0,&local_100);
  if (local_f0 != (undefined1  [8])&local_e0) {
    operator_delete((void *)local_f0,
                    CONCAT44(local_e0._vptr__Sp_counted_base._4_4_,
                             local_e0._vptr__Sp_counted_base._0_4_) + 1);
  }
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)local_f0,"p.last_error ()","error",local_68,&local_d0);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((coord)local_100.storage_.super_extent_type<_1L>.size_ != (coord)0x0) {
      (**(code **)(*(long *)local_100.storage_.super_extent_type<_1L>.size_ + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  local_100.storage_.super_extent_type<_1L>.size_._0_4_ = local_28.column;
  local_100.storage_.super_extent_type<_1L>.size_._4_4_ = local_28.row;
  local_108.column = 1;
  local_108.row = 1;
  testing::internal::CmpHelperEQ<pstore::json::coord,pstore::json::coord>
            ((internal *)local_f0,"p.coordinate ()","(json::coord{1U, 1U})",(coord *)&local_100,
             &local_108);
  if (local_f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_100);
    if (local_e8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_e8->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_array.cpp"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
    if ((coord)local_100.storage_.super_extent_type<_1L>.size_ != (coord)0x0) {
      (**(code **)(*(long *)local_100.storage_.super_extent_type<_1L>.size_ + 8))();
    }
  }
  if (local_e8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e8,local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_p != &local_38) {
    operator_delete(local_48._M_p,local_38._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque((deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
            *)(local_c0 + 8));
  if ((void *)local_c0._0_8_ != (void *)0x0) {
    operator_delete((void *)local_c0._0_8_,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonArray, BeginArrayReturnsError) {
    std::error_code const error = make_error_code (std::errc::io_error);
    using ::testing::Return;
    EXPECT_CALL (callbacks_, begin_array ()).WillOnce (Return (error));

    auto p = json::make_parser (proxy_);
    p.input ("[\n]\n"s);
    EXPECT_EQ (p.last_error (), error);
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 1U}));
}